

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTC.cc
# Opt level: O0

void QTC::TC_real(char *scope,char *ccase,int n)

{
  bool bVar1;
  int iVar2;
  mapped_type_conflict1 *pmVar3;
  pointer ppVar4;
  size_type sVar5;
  char *pcVar6;
  FILE *__stream;
  pair<const_char_*,_int> pVar7;
  FILE *tc;
  pair<const_char_*,_int> local_188;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_178;
  char *local_150;
  int local_148;
  pair<const_char_*,_int> local_140;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_130;
  undefined4 local_108;
  allocator<char> local_101;
  string local_100;
  undefined1 local_e0 [8];
  string filename;
  key_type local_b8;
  _Base_ptr local_98;
  allocator<char> local_89;
  key_type local_88;
  _Self local_68 [3];
  allocator<char> local_49;
  key_type local_48;
  _Self local_28;
  iterator is_active;
  char *pcStack_18;
  int n_local;
  char *ccase_local;
  char *scope_local;
  
  is_active._M_node._4_4_ = n;
  pcStack_18 = ccase;
  ccase_local = scope;
  if ((TC_real(char_const*,char_const*,int)::active_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&TC_real(char_const*,char_const*,int)::active_abi_cxx11_),
     iVar2 != 0)) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::map(&TC_real(char_const*,char_const*,int)::active_abi_cxx11_);
    __cxa_atexit(std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                 ::~map,&TC_real(char_const*,char_const*,int)::active_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&TC_real(char_const*,char_const*,int)::active_abi_cxx11_);
  }
  pcVar6 = ccase_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,pcVar6,&local_49);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
       ::find(&TC_real(char_const*,char_const*,int)::active_abi_cxx11_,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  local_68[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
       ::end(&TC_real(char_const*,char_const*,int)::active_abi_cxx11_);
  bVar1 = std::operator==(&local_28,local_68);
  if (bVar1) {
    bVar1 = tc_active(ccase_local);
    pcVar6 = ccase_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,pcVar6,&local_89);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[](&TC_real(char_const*,char_const*,int)::active_abi_cxx11_,&local_88);
    *pmVar3 = bVar1;
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    pcVar6 = ccase_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,pcVar6,(allocator<char> *)(filename.field_2._M_local_buf + 0xf));
    local_98 = (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               ::find(&TC_real(char_const*,char_const*,int)::active_abi_cxx11_,&local_b8);
    local_28._M_node = local_98;
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator((allocator<char> *)(filename.field_2._M_local_buf + 0xf));
  }
  ppVar4 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
           ::operator->(&local_28);
  if ((ppVar4->second & 1U) != 0) {
    if ((TC_real(char_const*,char_const*,int)::cache_abi_cxx11_ == '\0') &&
       (iVar2 = __cxa_guard_acquire(&TC_real(char_const*,char_const*,int)::cache_abi_cxx11_),
       iVar2 != 0)) {
      std::
      set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::set(&TC_real(char_const*,char_const*,int)::cache_abi_cxx11_);
      __cxa_atexit(std::
                   set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::~set,&TC_real(char_const*,char_const*,int)::cache_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&TC_real(char_const*,char_const*,int)::cache_abi_cxx11_);
    }
    std::__cxx11::string::string((string *)local_e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"TC_FILENAME",&local_101);
    bVar1 = QUtil::get_env(&local_100,(string *)local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator(&local_101);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      pVar7 = std::make_pair<char_const*const&,int&>
                        (&stack0xffffffffffffffe8,(int *)((long)&is_active._M_node + 4));
      local_150 = pVar7.first;
      local_148 = pVar7.second;
      local_140.first = local_150;
      local_140.second = local_148;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
      pair<const_char_*,_int,_true>(&local_130,&local_140);
      sVar5 = std::
              set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::count(&TC_real(char_const*,char_const*,int)::cache_abi_cxx11_,&local_130);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
      ~pair(&local_130);
      if (sVar5 == 0) {
        pVar7 = std::make_pair<char_const*const&,int&>
                          (&stack0xffffffffffffffe8,(int *)((long)&is_active._M_node + 4));
        local_188.first = pVar7.first;
        local_188.second = pVar7.second;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
        pair<const_char_*,_int,_true>(&local_178,&local_188);
        std::
        set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ::insert(&TC_real(char_const*,char_const*,int)::cache_abi_cxx11_,&local_178);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
        ~pair(&local_178);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        __stream = (FILE *)QUtil::safe_fopen(pcVar6,"ab");
        fprintf(__stream,"%s %d\n",pcStack_18,(ulong)is_active._M_node._4_4_);
        fclose(__stream);
        local_108 = 0;
      }
      else {
        local_108 = 1;
      }
    }
    else {
      local_108 = 1;
    }
    std::__cxx11::string::~string((string *)local_e0);
  }
  return;
}

Assistant:

void
QTC::TC_real(char const* const scope, char const* const ccase, int n)
{
    static std::map<std::string, bool> active;
    auto is_active = active.find(scope);
    if (is_active == active.end()) {
        active[scope] = tc_active(scope);
        is_active = active.find(scope);
    }

    if (!is_active->second) {
        return;
    }

    static std::set<std::pair<std::string, int>> cache;

    std::string filename;
#ifdef _WIN32
# define TC_ENV "TC_WIN_FILENAME"
#else
# define TC_ENV "TC_FILENAME"
#endif
    if (!QUtil::get_env(TC_ENV, &filename)) {
        return;
    }
#undef TC_ENV

    if (cache.count(std::make_pair(ccase, n))) {
        return;
    }
    cache.insert(std::make_pair(ccase, n));

    FILE* tc = QUtil::safe_fopen(filename.c_str(), "ab");
    fprintf(tc, "%s %d\n", ccase, n);
    fclose(tc);
}